

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_date.cpp
# Opt level: O2

void duckdb::MakeTimestampNsFun::GetFunctions(void)

{
  long in_RDI;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_1d9;
  code *local_1d8 [2];
  code *local_1c8;
  code *local_1c0;
  allocator local_1b8 [24];
  LogicalType local_1a0 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_188;
  LogicalType local_170 [24];
  string local_158 [32];
  ScalarFunction local_138;
  
  std::__cxx11::string::string(local_158,"make_timestamp_ns",local_1b8);
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  std::__cxx11::string::~string(local_158);
  duckdb::LogicalType::LogicalType((LogicalType *)local_1b8,BIGINT);
  __l._M_len = 1;
  __l._M_array = (iterator)local_1b8;
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_188,__l,&local_1d9);
  duckdb::LogicalType::LogicalType(local_1a0,TIMESTAMP_NS);
  local_1d8[1] = (code *)0x0;
  local_1d8[0] = ExecuteMakeTimestampNs<long>;
  local_1c0 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_invoke;
  local_1c8 = std::
              _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
              ::_M_manager;
  duckdb::LogicalType::LogicalType(local_170,INVALID);
  duckdb::ScalarFunction::ScalarFunction
            (&local_138,&local_188,local_1a0,local_1d8,0,0,0,0,local_170,0,0,0);
  std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
  emplace_back<duckdb::ScalarFunction>
            ((vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
             (in_RDI + 0x20),&local_138);
  ScalarFunction::~ScalarFunction(&local_138);
  duckdb::LogicalType::~LogicalType(local_170);
  std::_Function_base::~_Function_base((_Function_base *)local_1d8);
  duckdb::LogicalType::~LogicalType(local_1a0);
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_188);
  duckdb::LogicalType::~LogicalType((LogicalType *)local_1b8);
  return;
}

Assistant:

ScalarFunctionSet MakeTimestampNsFun::GetFunctions() {
	ScalarFunctionSet operator_set("make_timestamp_ns");
	operator_set.AddFunction(
	    ScalarFunction({LogicalType::BIGINT}, LogicalType::TIMESTAMP_NS, ExecuteMakeTimestampNs<int64_t>));
	return operator_set;
}